

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O0

void __thiscall
t_php_generator::generate_php_docstring_comment(t_php_generator *this,ostream *out,string *contents)

{
  allocator local_a1;
  string local_a0;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  string *local_20;
  string *contents_local;
  ostream *out_local;
  t_php_generator *this_local;
  
  local_20 = contents;
  contents_local = (string *)out;
  out_local = (ostream *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"/**\n",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78," * ",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0," */\n",&local_a1);
  t_generator::generate_docstring_comment
            ((t_generator *)this,out,&local_40,&local_78,contents,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

void t_php_generator::generate_php_docstring_comment(ostream& out, string contents) {
  generate_docstring_comment(out, "/**\n", " * ", contents, " */\n");
}